

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void expand_suite::expand_empty(void)

{
  undefined4 local_6c;
  size_type local_68;
  undefined4 local_5c;
  size_type local_58;
  undefined4 local_4c;
  size_type local_48 [2];
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  memset(&span.member.next,0,0x10);
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  local_48[0] = vista::circular_view<int,_18446744073709551615UL>::size
                          ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_4c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xad3,"void expand_suite::expand_empty()",local_48,&local_4c);
  vista::circular_view<int,_18446744073709551615UL>::expand_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,1);
  local_58 = vista::circular_view<int,_18446744073709551615UL>::size
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_5c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xad5,"void expand_suite::expand_empty()",&local_58,&local_5c);
  vista::circular_view<int,_18446744073709551615UL>::expand_front
            ((circular_view<int,_18446744073709551615UL> *)local_38,1);
  local_68 = vista::circular_view<int,_18446744073709551615UL>::size
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_6c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xad7,"void expand_suite::expand_empty()",&local_68,&local_6c);
  return;
}

Assistant:

void expand_empty()
{
    int array[4] = {};
    circular_view<int> span(array);
    BOOST_TEST_EQ(span.size(), 0);
    span.expand_back(1);
    BOOST_TEST_EQ(span.size(), 1);
    span.expand_front(1);
    BOOST_TEST_EQ(span.size(), 2);
}